

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O2

void rep0_pipe_close(void *arg)

{
  __pthread_list_t *list;
  nni_mtx *mtx;
  nni_aio *aio;
  int iVar1;
  uint32_t uVar2;
  void *item;
  nni_msg *m;
  size_t count;
  
  mtx = *(nni_mtx **)((long)arg + 8);
  nni_aio_close((nni_aio *)((long)arg + 0x18));
  nni_aio_close((nni_aio *)((long)arg + 0x1e0));
  nni_mtx_lock(mtx);
  *(undefined1 *)((long)arg + 0x3d1) = 1;
  list = &mtx[2].mtx.__data.__list;
  iVar1 = nni_list_active((nni_list *)list,arg);
  if (iVar1 != 0) {
    nni_list_remove((nni_list *)list,arg);
  }
  while( true ) {
    item = nni_list_first((nni_list *)((long)arg + 0x3b8));
    if (item == (void *)0x0) break;
    nni_list_remove((nni_list *)((long)arg + 0x3b8),item);
    aio = *(nni_aio **)((long)item + 0x18);
    *(undefined8 *)((long)item + 0x18) = 0;
    m = nni_aio_get_msg(aio);
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    count = nni_msg_len(m);
    nni_aio_finish(aio,NNG_OK,count);
    nni_msg_free(m);
  }
  if (*(int *)((long)arg + 0x10) == mtx[4].mtx.__data.__lock) {
    nni_pollable_raise((nni_pollable *)&mtx[7].mtx.__data.__list.__next);
  }
  uVar2 = nni_pipe_id(*arg);
  nni_id_remove((nni_id_map *)((long)&mtx[1].mtx + 8),(ulong)uVar2);
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
rep0_pipe_close(void *arg)
{
	rep0_pipe *p = arg;
	rep0_sock *s = p->rep;
	rep0_ctx  *ctx;

	nni_aio_close(&p->aio_send);
	nni_aio_close(&p->aio_recv);

	nni_mtx_lock(&s->lk);
	p->closed = true;
	if (nni_list_active(&s->recvpipes, p)) {
		// We are no longer "receivable".
		nni_list_remove(&s->recvpipes, p);
	}
	while ((ctx = nni_list_first(&p->sendq)) != NULL) {
		nni_aio *aio;
		nni_msg *msg;
		// Pipe was closed.  To avoid pushing an error back to the
		// entire socket, we pretend we completed this successfully.
		nni_list_remove(&p->sendq, ctx);
		aio       = ctx->saio;
		ctx->saio = NULL;
		msg       = nni_aio_get_msg(aio);
		nni_aio_set_msg(aio, NULL);
		nni_aio_finish(aio, 0, nni_msg_len(msg));
		nni_msg_free(msg);
	}
	if (p->id == s->ctx.pipe_id) {
		// We "can" send.  (Well, not really, but we will happily
		// accept a message and discard it.)
		nni_pollable_raise(&s->writable);
	}
	nni_id_remove(&s->pipes, nni_pipe_id(p->pipe));
	nni_mtx_unlock(&s->lk);
}